

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

void __thiscall
Args::Command::checkCorrectnessBeforeParsing(Command *this,StringList *flags,StringList *names)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  BaseException *pBVar5;
  allocator local_d1;
  StringList ftmp;
  StringList ntmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])((String *)&ftmp,this);
  bVar3 = details::isCorrectName((String *)&ftmp);
  std::__cxx11::string::~string((string *)&ftmp);
  if (!bVar3) {
    pBVar5 = (BaseException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&ntmp,"Disallowed name \"",&local_d1);
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_90,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ntmp,
                   &local_90);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp,
                   "\" for the command.");
    BaseException::BaseException(pBVar5,&local_70);
    __cxa_throw(pBVar5,&BaseException::typeinfo,BaseException::~BaseException);
  }
  pbVar1 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&ftmp,this);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar1,pbVar2,&ftmp);
  std::__cxx11::string::~string((string *)&ftmp);
  if (_Var4._M_current ==
      (names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp,this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp);
    std::__cxx11::string::~string((string *)&ftmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&ftmp,flags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&ntmp,names);
    GroupIface::checkCorrectnessBeforeParsing(&this->super_GroupIface,&ftmp,&ntmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ntmp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ftmp);
    return;
  }
  pBVar5 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&ntmp,"Redefinition of command with name \"",&local_d1);
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_90,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ntmp,
                 &local_90);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftmp,"\".");
  BaseException::BaseException(pBVar5,&local_50);
  __cxa_throw(pBVar5,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		if( details::isCorrectName( name() ) )
		{
			auto it = std::find( names.begin(), names.end(), name() );

			if( it != names.end() )
				throw BaseException( String( SL( "Redefinition of command "
					"with name \"" ) ) + name() + SL( "\"." ) );
			else
				names.push_back( name() );
		}
		else
			throw BaseException( String( SL( "Disallowed name \"" ) ) +
				name() + SL( "\" for the command." ) );

		StringList ftmp = flags;
		StringList ntmp = names;

		GroupIface::checkCorrectnessBeforeParsing( ftmp, ntmp );
	}